

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheOperators.cpp
# Opt level: O1

bool Js::CacheOperators::CanCachePropertyWrite
               (RecyclableObject *object,ScriptContext *requestContext)

{
  Type *pTVar1;
  bool bVar2;
  
  pTVar1 = (object->type).ptr;
  if (((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr ==
       requestContext) && (bVar2 = DynamicType::Is(pTVar1->typeId), bVar2)) {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_015bbe90,InlineCachePhase);
    return !bVar2;
  }
  return false;
}

Assistant:

bool CacheOperators::CanCachePropertyWrite(RecyclableObject * object, ScriptContext * requestContext)
    {
        return object->GetScriptContext() == requestContext && DynamicType::Is(object->GetTypeId()) && !PHASE_OFF1(InlineCachePhase);
    }